

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
license::unbase64(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
                 string *base64_data)

{
  byte local_e5;
  uint local_e4;
  uint local_e0;
  int B_2;
  int A_2;
  uint local_d4;
  int C_1;
  int B_1;
  int A_1;
  uint local_c4;
  int D;
  int C;
  int B;
  int A;
  size_t flen;
  ulong local_a8;
  size_t len;
  uint local_98;
  int pad;
  uint charNo;
  uchar *safeAsciiPtr;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined8 local_78 [3];
  char local_59;
  char *local_58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  undefined8 local_40;
  string local_38 [8];
  string tmp_str;
  string *base64_data_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bin;
  
  tmp_str.field_2._8_8_ = base64_data;
  std::__cxx11::string::string(local_38,(string *)base64_data);
  local_50._M_current = (char *)std::__cxx11::string::begin();
  local_58 = (char *)std::__cxx11::string::end();
  local_59 = '\n';
  local_48 = std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                       (local_50,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )local_58,&local_59);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_40,&local_48);
  local_80._M_current = (char *)std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)local_78,&local_80);
  safeAsciiPtr = (uchar *)std::__cxx11::string::erase(local_38,local_40,local_78[0]);
  _charNo = std::__cxx11::string::c_str();
  pad._3_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  len._4_4_ = 0;
  local_a8 = std::__cxx11::string::size();
  if (local_a8 < 2) {
    puts("ERROR: You passed an invalid base64 string (too short). You get NULL back.");
  }
  else {
    if (*(char *)(_charNo + (local_a8 - 1)) == '=') {
      len._4_4_ = len._4_4_ + 1;
    }
    if (*(char *)(_charNo + (local_a8 - 2)) == '=') {
      len._4_4_ = len._4_4_ + 1;
    }
    _B = (local_a8 * 3 >> 2) - (long)len._4_4_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(__return_storage_ptr__,_B);
    for (local_98 = 0; (ulong)local_98 <= (local_a8 - 4) - (long)len._4_4_; local_98 = local_98 + 4)
    {
      C = (int)(byte)unb64[*(byte *)(_charNo + (ulong)local_98)];
      D = (int)(byte)unb64[*(byte *)(_charNo + (ulong)(local_98 + 1))];
      local_c4 = (uint)(byte)unb64[*(byte *)(_charNo + (ulong)(local_98 + 2))];
      A_1 = (int)(byte)unb64[*(byte *)(_charNo + (ulong)(local_98 + 3))];
      B_1._3_1_ = unb64[*(byte *)(_charNo + (ulong)local_98)] << 2 |
                  (byte)unb64[*(byte *)(_charNo + (ulong)(local_98 + 1))] >> 4;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,(value_type_conflict3 *)((long)&B_1 + 3));
      B_1._2_1_ = (byte)(D << 4) | (byte)(local_c4 >> 2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,(value_type_conflict3 *)((long)&B_1 + 2));
      B_1._1_1_ = (byte)(local_c4 << 6) | (byte)A_1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,(value_type_conflict3 *)((long)&B_1 + 1));
    }
    if (len._4_4_ == 1) {
      C_1 = (int)(byte)unb64[*(byte *)(_charNo + (ulong)local_98)];
      local_d4 = (uint)(byte)unb64[*(byte *)(_charNo + (ulong)(local_98 + 1))];
      A_2 = (int)(byte)unb64[*(byte *)(_charNo + (ulong)(local_98 + 2))];
      B_2._3_1_ = unb64[*(byte *)(_charNo + (ulong)local_98)] << 2 |
                  (byte)unb64[*(byte *)(_charNo + (ulong)(local_98 + 1))] >> 4;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,(value_type_conflict3 *)((long)&B_2 + 3));
      B_2._2_1_ = (byte)(local_d4 << 4) | (byte)((uint)A_2 >> 2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,(value_type_conflict3 *)((long)&B_2 + 2));
    }
    else if (len._4_4_ == 2) {
      local_e0 = (uint)(byte)unb64[*(byte *)(_charNo + (ulong)local_98)];
      local_e4 = (uint)(byte)unb64[*(byte *)(_charNo + (ulong)(local_98 + 1))];
      local_e5 = unb64[*(byte *)(_charNo + (ulong)local_98)] << 2 |
                 (byte)unb64[*(byte *)(_charNo + (ulong)(local_98 + 1))] >> 4;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,&local_e5);
    }
  }
  pad._3_1_ = 1;
  flen._4_4_ = 1;
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> unbase64(const std::string& base64_data) {
	string tmp_str(base64_data);
	tmp_str.erase(std::remove(tmp_str.begin(), tmp_str.end(), '\n'), tmp_str.end());
	const unsigned char* safeAsciiPtr = (const unsigned char*)tmp_str.c_str();
	std::vector<uint8_t> bin;
	// int cb = 0;
	unsigned int charNo;
	int pad = 0;
	size_t len = tmp_str.size();

	if (len < 2) {  // 2 accesses below would be OOB.
		// catch empty string, return NULL as result.
		puts("ERROR: You passed an invalid base64 string (too short). You get NULL back.");
		return bin;
	}
	if (safeAsciiPtr[len - 1] == '=') ++pad;
	if (safeAsciiPtr[len - 2] == '=') ++pad;

	size_t flen = 3 * len / 4 - pad;
	bin.reserve(flen);

	for (charNo = 0; charNo <= len - 4 - pad; charNo += 4) {
		int A = unb64[safeAsciiPtr[charNo]];
		int B = unb64[safeAsciiPtr[charNo + 1]];
		int C = unb64[safeAsciiPtr[charNo + 2]];
		int D = unb64[safeAsciiPtr[charNo + 3]];

		bin.push_back((A << 2) | (B >> 4));
		bin.push_back((B << 4) | (C >> 2));
		bin.push_back((C << 6) | (D));
	}

	if (pad == 1) {
		int A = unb64[safeAsciiPtr[charNo]];
		int B = unb64[safeAsciiPtr[charNo + 1]];
		int C = unb64[safeAsciiPtr[charNo + 2]];
		bin.push_back((A << 2) | (B >> 4));
		bin.push_back((B << 4) | (C >> 2));
	} else if (pad == 2) {
		int A = unb64[safeAsciiPtr[charNo]];
		int B = unb64[safeAsciiPtr[charNo + 1]];
		bin.push_back((A << 2) | (B >> 4));
	}

	return bin;
}